

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O1

void __thiscall
Iir::ChebyshevI::AnalogLowPass::design(AnalogLowPass *this,int numPoles,double rippleDb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  complex_t local_68;
  complex_t local_58;
  undefined1 local_48 [16];
  
  if (this->m_numPoles == numPoles) {
    if ((this->m_rippleDb == rippleDb) && (!NAN(this->m_rippleDb) && !NAN(rippleDb))) {
      return;
    }
  }
  this->m_numPoles = numPoles;
  this->m_rippleDb = rippleDb;
  (this->super_LayoutBase).m_numPoles = 0;
  dVar1 = exp(rippleDb * -0.1 * 2.302585092994046);
  dVar1 = 1.0 / dVar1 + -1.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar1 = 1.0 / dVar1;
  dVar2 = dVar1 * dVar1 + 1.0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar1 = log(dVar2 + dVar1);
  dVar2 = sinh(dVar1 / (double)numPoles);
  dVar1 = cosh(dVar1 / (double)numPoles);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = dVar1;
  local_48._12_4_ = extraout_XMM0_Dd;
  if (1 < numPoles) {
    iVar4 = numPoles / 2;
    iVar5 = 1 - numPoles;
    do {
      dVar1 = ((double)iVar5 * 3.141592653589793) / (double)(numPoles * 2);
      dVar3 = cos(dVar1);
      dVar1 = sin(dVar1);
      local_58._M_value._8_4_ = SUB84(dVar1 * (double)local_48._0_8_,0);
      local_58._M_value._0_8_ = -dVar2 * dVar3;
      local_58._M_value._12_4_ = (int)((ulong)(dVar1 * (double)local_48._0_8_) >> 0x20);
      local_68._M_value._0_8_ = 0x7ff0000000000000;
      local_68._M_value._8_8_ = 0;
      LayoutBase::addPoleZeroConjugatePairs(&this->super_LayoutBase,&local_58,&local_68);
      iVar5 = iVar5 + 2;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if ((numPoles & 1U) == 0) {
    dVar1 = pow(10.0,rippleDb / -20.0);
    uVar6 = SUB84(dVar1,0);
    uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    local_58._M_value._8_8_ = 0;
    local_58._M_value._0_8_ = -dVar2;
    local_68._M_value._0_8_ = 0x7ff0000000000000;
    local_68._M_value._8_8_ = 0;
    LayoutBase::add(&this->super_LayoutBase,&local_58,&local_68);
    uVar6 = 0;
    uVar7 = 0x3ff00000;
  }
  (this->super_LayoutBase).m_normalW = 0.0;
  (this->super_LayoutBase).m_normalGain = (double)CONCAT44(uVar7,uVar6);
  return;
}

Assistant:

void AnalogLowPass::design (int numPoles,
                            double rippleDb)
{
  if (m_numPoles != numPoles ||
      m_rippleDb != rippleDb)
  {
    m_numPoles = numPoles;
    m_rippleDb = rippleDb;

    reset ();

    const double eps = std::sqrt (1. / std::exp (-rippleDb * 0.1 * doubleLn10) - 1);
    const double v0 = asinh (1 / eps) / numPoles;
    const double sinh_v0 = -sinh (v0);
    const double cosh_v0 = cosh (v0);

    const double n2 = 2 * numPoles;
    const int pairs = numPoles / 2;
    for (int i = 0; i < pairs; ++i)
    {
      const int k = 2 * i + 1 - numPoles;
      double a = sinh_v0 * cos (k * doublePi / n2);
      double b = cosh_v0 * sin (k * doublePi / n2);

      addPoleZeroConjugatePairs (complex_t (a, b), infinity());
    }

    if (numPoles & 1)
    {
      add (complex_t (sinh_v0, 0), infinity());
      setNormal (0, 1);
    }
    else
    {
      setNormal (0, pow (10, -rippleDb/20.));
    }
  }
}